

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

SyHashEntry_Pr * HashGetEntry(SyHash *pHash,void *pKey,sxu32 nKeyLen)

{
  sxu32 sVar1;
  sxi32 sVar2;
  SyHashEntry_Pr *pSVar3;
  
  sVar1 = (*pHash->xHash)(pKey,nKeyLen);
  pSVar3 = pHash->apBucket[pHash->nBucketSize - 1 & sVar1];
  while( true ) {
    if (pSVar3 == (SyHashEntry_Pr *)0x0) {
      return (SyHashEntry_Pr *)0x0;
    }
    if (((pSVar3->nHash == sVar1) && (pSVar3->nKeyLen == nKeyLen)) &&
       (sVar2 = (*pHash->xCmp)(pSVar3->pKey,pKey,nKeyLen), sVar2 == 0)) break;
    pSVar3 = pSVar3->pNextCollide;
  }
  return pSVar3;
}

Assistant:

static SyHashEntry_Pr * HashGetEntry(SyHash *pHash, const void *pKey, sxu32 nKeyLen)
{
	SyHashEntry_Pr *pEntry;
	sxu32 nHash;

	nHash = pHash->xHash(pKey, nKeyLen);
	pEntry = pHash->apBucket[nHash & (pHash->nBucketSize - 1)];
	for(;;){
		if( pEntry == 0 ){
			break;
		}
		if( pEntry->nHash == nHash && pEntry->nKeyLen == nKeyLen && 
			pHash->xCmp(pEntry->pKey, pKey, nKeyLen) == 0 ){
				return pEntry;
		}
		pEntry = pEntry->pNextCollide;
	}
	/* Entry not found */
	return 0;
}